

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::permute_axes(CImg<unsigned_char> *this,char *axes_order)

{
  CImg<unsigned_char> *pCVar1;
  CImg<unsigned_char> local_30;
  
  get_permute_axes(&local_30,this,axes_order);
  pCVar1 = move_to(&local_30,this);
  ~CImg(&local_30);
  return pCVar1;
}

Assistant:

CImg<T>& permute_axes(const char *const axes_order) {
      return get_permute_axes(axes_order).move_to(*this);
    }